

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O2

int match_rule(ip_rule_t *ipr,packet_t *pkt)

{
  list_head *plVar1;
  ip_target_t *piVar2;
  _func_int_void_ptr_packet_t_ptr *UNRECOVERED_JUMPTABLE;
  int iVar3;
  list_head *plVar4;
  
  iVar3 = match_ip(ipr,pkt);
  if (iVar3 != 0) {
    plVar4 = &ipr->matchs;
    do {
      plVar4 = plVar4->next;
      if (plVar4 == &ipr->matchs) {
        printf("%s\t: ","match_rule");
        for (iVar3 = (int)match_rule::depth; 0 < iVar3; iVar3 = iVar3 + -1) {
          printf("    ");
        }
        print_rule(ipr);
        iVar3 = ipr->target;
        if (iVar3 == 4) {
          piVar2 = ipr->target_ext;
          if (piVar2 == (ip_target_t *)0x0) {
            return 4;
          }
          if (piVar2->map == (ip_target_map_t *)0x0) {
            return 4;
          }
          UNRECOVERED_JUMPTABLE = piVar2->map->func_target;
          if (UNRECOVERED_JUMPTABLE == (_func_int_void_ptr_packet_t_ptr *)0x0) {
            return 4;
          }
          iVar3 = (*UNRECOVERED_JUMPTABLE)(piVar2->data,pkt);
          return iVar3;
        }
        if (iVar3 != 5) {
          return iVar3;
        }
        if (ipr->target_child != (ip_chain_t *)0x0) {
          match_rule::depth = match_rule::depth + '\x01';
          iVar3 = match_chain(ipr->target_child,pkt);
          match_rule::depth = match_rule::depth + -1;
          if (iVar3 != 6) {
            return iVar3;
          }
          if (ipr->go == '\0') {
            return 6;
          }
          return 3;
        }
        return 5;
      }
    } while (((plVar4[-1].next == (list_head *)0x0) ||
             (plVar1 = plVar4[-1].next[2].next, plVar1 == (list_head *)0x0)) ||
            (iVar3 = (*(code *)plVar1)(plVar4[-1].prev,pkt), iVar3 != 0));
  }
  return 6;
}

Assistant:

int match_rule(ip_rule_t *ipr, packet_t *pkt)
{
	static int8_t depth = 0;
	if (!match_ip(ipr, pkt)) {
		return TARGET_NONE;
	}

	ip_match_t *ipm = NULL;
	list_for_each_entry(ipm, &ipr->matchs, list) {
		if (ipm->map && ipm->map->func_match) {
			if (!(ipm->map->func_match(ipm->data, pkt))) {
				return TARGET_NONE;
			}
		}
	}

	printf("%s	: ", __FUNCTION__);
	for (int i = depth; i > 0; printf("    "), i--);
	print_rule(ipr);

	if (ipr->target == TARGET_EXT && ipr->target_ext &&
		ipr->target_ext->map && ipr->target_ext->map->func_target) {
		return ipr->target_ext->map->func_target(ipr->target_ext->data, pkt);
	}

	if (ipr->target == TARGET_CHILD && ipr->target_child) {
		depth++;
		int target = match_chain(ipr->target_child, pkt);
		depth--;
		if (target == TARGET_NONE && ipr->go) {
			return TARGET_RETURN;
		} else {
			return target;
		}
	}

	return ipr->target;
}